

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zp_field_shared.h
# Opt level: O0

Element_conflict
Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::_add
          (Element_conflict element,Element_conflict v)

{
  undefined4 local_10;
  Element_conflict v_local;
  Element_conflict element_local;
  
  if (-element - 1 < v) {
    v_local = (v + element) - characteristic_;
  }
  else {
    local_10 = v + element;
    if (characteristic_ <= local_10) {
      local_10 = local_10 - characteristic_;
    }
    v_local = local_10;
  }
  return v_local;
}

Assistant:

static Element _add(Element element, Element v) {
    if (UINT_MAX - element < v) {
      // automatic unsigned integer overflow behaviour will make it work
      element += v;
      element -= characteristic_;
      return element;
    }

    element += v;
    if (element >= characteristic_) element -= characteristic_;

    return element;
  }